

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeForwardPointer(Builder *this,StorageClass storageClass)

{
  Id IVar1;
  Instruction *this_00;
  mapped_type_conflict *pmVar2;
  Id local_2c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  
  this_00 = (Instruction *)operator_new(0x60);
  IVar1 = this->uniqueId + 1;
  this->uniqueId = IVar1;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  this_00->resultId = IVar1;
  this_00->typeId = 0;
  this_00->opCode = OpTypeForwardPointer;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  Instruction::addImmediateOperand(this_00,storageClass);
  local_28._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_28);
  if (local_28._M_head_impl != (Instruction *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,this_00);
  if (this->emitNonSemanticShaderDebugInfo == true) {
    IVar1 = makeForwardPointerDebugType(this,storageClass);
    local_2c = this_00->resultId;
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_2c);
    *pmVar2 = IVar1;
  }
  return this_00->resultId;
}

Assistant:

Id Builder::makeForwardPointer(StorageClass storageClass)
{
    // Caching/uniquifying doesn't work here, because we don't know the
    // pointee type and there can be multiple forward pointers of the same
    // storage type. Somebody higher up in the stack must keep track.
    Instruction* type = new Instruction(getUniqueId(), NoType, OpTypeForwardPointer);
    type->addImmediateOperand(storageClass);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo) {
        const Id debugResultId = makeForwardPointerDebugType(storageClass);
        debugId[type->getResultId()] = debugResultId;
    }
    return type->getResultId();
}